

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynet.h
# Opt level: O1

VariableIndex __thiscall
dynet::ComputationGraph::add_function<dynet::ToDevice,dynet::Device*&>
          (ComputationGraph *this,initializer_list<unsigned_int> *arguments,
          Device **side_information)

{
  pointer *pppNVar1;
  Device *pDVar2;
  iterator __position;
  Node *pNVar3;
  Device **ppDVar4;
  VariableIndex new_node_index;
  allocator_type local_2d;
  VariableIndex local_2c;
  Node *local_28;
  
  local_2c = (VariableIndex)
             ((ulong)((long)(this->nodes).
                            super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->nodes).
                           super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl
                           .super__Vector_impl_data._M_start) >> 3);
  pNVar3 = (Node *)operator_new(0x60);
  pDVar2 = *side_information;
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_005bafc8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&pNVar3->args,*arguments,&local_2d);
  (pNVar3->dim).nd = 0;
  (pNVar3->dim).bd = 1;
  pNVar3->device = pDVar2;
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_005bf910;
  __position._M_current =
       (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_28 = pNVar3;
  if (__position._M_current ==
      (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<dynet::Node*,std::allocator<dynet::Node*>>::_M_realloc_insert<dynet::Node*>
              ((vector<dynet::Node*,std::allocator<dynet::Node*>> *)this,__position,&local_28);
  }
  else {
    *__position._M_current = pNVar3;
    pppNVar1 = &(this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  pNVar3 = (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  if (pNVar3->device == (Device *)0x0) {
    if (arguments->_M_len == 0) {
      ppDVar4 = (Device **)&dynet::default_device;
    }
    else {
      ppDVar4 = &(this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[*arguments->_M_array]->device;
    }
    pNVar3->device = *ppDVar4;
  }
  set_dim_for_new_node(this,&local_2c);
  return local_2c;
}

Assistant:

inline VariableIndex ComputationGraph::add_function(const std::initializer_list<VariableIndex>& arguments,
    Args&&... side_information) {
  VariableIndex new_node_index(nodes.size());
  nodes.push_back(new Function(arguments, std::forward<Args>(side_information)...));
  if (nodes.back()->device == nullptr) {
    if (arguments.size()) {
      nodes.back()->device = nodes[*arguments.begin()]->device;
    } else {
      nodes.back()->device = dynet::default_device;
    }
  }
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}